

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_sign.c
# Opt level: O3

err_t bignSign2(octet *sig,bign_params *params,octet *oid_der,size_t oid_len,octet *hash,
               octet *privkey,void *t,size_t t_len)

{
  u64 *dest;
  octet *hash_00;
  ulong count;
  bool_t bVar1;
  err_t eVar2;
  int iVar3;
  size_t sVar4;
  ec_o *ec;
  ulong hash_len;
  size_t sVar5;
  word wVar6;
  word *b;
  ulong n;
  word *state;
  u64 *dest_00;
  
  bVar1 = memIsValid(params,0x150);
  eVar2 = 0x6d;
  if (bVar1 != 0) {
    bVar1 = bignIsOperable(params);
    if (bVar1 == 0) {
      eVar2 = 0x1f6;
    }
    else {
      eVar2 = 0x12d;
      if ((oid_len != 0xffffffffffffffff) &&
         (sVar4 = oidFromDER((char *)0x0,oid_der,oid_len), sVar4 != 0xffffffffffffffff)) {
        if ((t != (void *)0x0) && (bVar1 = memIsValid(t,t_len), bVar1 == 0)) {
          return 0x6d;
        }
        sVar4 = bignStart_keep(params->l,bignSign2_deep);
        ec = (ec_o *)blobCreate(sVar4);
        if (ec == (ec_o *)0x0) {
          eVar2 = 0x6e;
        }
        else {
          eVar2 = bignStart(ec,params);
          if (eVar2 == 0) {
            sVar4 = ec->f->n;
            count = ec->f->no;
            bVar1 = memIsValid(hash,count);
            eVar2 = 0x6d;
            if ((bVar1 != 0) && (bVar1 = memIsValid(privkey,count), bVar1 != 0)) {
              hash_len = count >> 1;
              bVar1 = memIsValid(sig,hash_len + count);
              if ((bVar1 != 0) &&
                 (bVar1 = memIsDisjoint2(hash,count,sig,hash_len + count), bVar1 != 0)) {
                dest_00 = (u64 *)((long)&(ec->hdr).keep + (ec->hdr).keep);
                sVar5 = beltHash_keep();
                u64From(dest_00,privkey,count);
                bVar1 = wwIsZero(dest_00,sVar4);
                eVar2 = 0x1f8;
                if ((bVar1 == 0) && (iVar3 = wwCmp(dest_00,ec->order,sVar4), iVar3 < 0)) {
                  dest = dest_00 + sVar4;
                  b = dest + sVar4;
                  n = sVar4 >> 1;
                  state = b + sVar4 * 2;
                  hash_00 = (octet *)(sVar5 + (long)state);
                  beltHashStart(state);
                  beltHashStepH(oid_der,oid_len,state);
                  sVar5 = beltHash_keep();
                  memCopy(hash_00,state,sVar5);
                  beltHashStepH(privkey,count,hash_00);
                  if (t != (void *)0x0) {
                    beltHashStepH(t,t_len,hash_00);
                  }
                  beltHashStepG(hash_00,hash_00);
                  beltWBLStart(hash_00,hash_00,0x20);
                  memCopy(dest,hash,count);
                  while( true ) {
                    beltWBLStepE(dest,count,hash_00);
                    u64From(dest,dest,count);
                    bVar1 = wwIsZero(dest,sVar4);
                    if ((bVar1 == 0) && (iVar3 = wwCmp(dest,ec->order,sVar4), iVar3 < 0)) break;
                    u64To(dest,count,dest);
                  }
                  bVar1 = ecMulA(b,ec->base,ec,dest,sVar4,hash_00);
                  if (bVar1 == 0) {
                    eVar2 = 0x1f6;
                  }
                  else {
                    (*ec->f->to)((octet *)b,b,ec->f,hash_00);
                    beltHashStepH(b,count,state);
                    beltHashStepH(hash,count,state);
                    beltHashStepG2(sig,hash_len,state);
                    u64From(b + sVar4 + n,sig,hash_len);
                    zzMul(b,b + sVar4 + n,n,dest_00,sVar4,hash_00);
                    wVar6 = zzAdd(b + n,b + n,dest_00,sVar4);
                    b[n + sVar4] = wVar6;
                    zzMod(dest_00,b,n + sVar4 + 1,ec->order,sVar4,hash_00);
                    zzSubMod(dest_00,dest,dest_00,ec->order,sVar4);
                    u64From(dest,hash,count);
                    zzSubMod(dest_00,dest_00,dest,ec->order,sVar4);
                    u64To(sig + hash_len,count,dest_00);
                    eVar2 = 0;
                  }
                }
              }
            }
          }
          blobClose(ec);
        }
      }
    }
  }
  return eVar2;
}

Assistant:

err_t bignSign2(octet sig[], const bign_params* params, const octet oid_der[],
	size_t oid_len, const octet hash[], const octet privkey[], const void* t, 
	size_t t_len)
{
	err_t code;
	size_t no, n;
	// состояние (буферы могут пересекаться)
	void* state;
	ec_o* ec;				/* описание эллиптической кривой */
	word* d;				/* [n] личный ключ */
	word* k;				/* [n] одноразовый личный ключ */
	word* R;				/* [2n] точка R */
	word* s0;				/* [n/2] первая часть подписи */
	word* s1;				/* [n] вторая часть подписи */
	octet* hash_state;		/* [beltHash_keep] состояние хэширования */
	octet* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	// проверить oid_der
	if (oid_len == SIZE_MAX || oidFromDER(0, oid_der, oid_len)  == SIZE_MAX)
		return ERR_BAD_OID;
	// проверить t
	if (!memIsNullOrValid(t, t_len))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(bignStart_keep(params->l, bignSign2_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bignStart(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	no  = ec->f->no;
	n = ec->f->n;
	ASSERT(n % 2 == 0);
	// проверить входные указатели
	if (!memIsValid(hash, no) ||
		!memIsValid(privkey, no) ||
		!memIsValid(sig, no + no / 2) ||
		!memIsDisjoint2(hash, no, sig, no + no / 2))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = s1 = objEnd(ec, word);
	k = d + n;
	R = k + n;
	s0 = R + n + n / 2;
	hash_state = (octet*)(R + 2 * n);
	stack = hash_state + beltHash_keep();
	// загрузить d
	wwFrom(d, privkey, no);
	if (wwIsZero(d, n) || wwCmp(d, ec->order, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_PRIVKEY;
	}
	// хэшировать oid
	beltHashStart(hash_state);
	beltHashStepH(oid_der, oid_len, hash_state);
	// сгенерировать k по алгоритму 6.3.3
	{
		// theta <- belt-hash(oid || d || t)
		memCopy(stack, hash_state, beltHash_keep());
		beltHashStepH(privkey, no, stack);
		if (t != 0)
			beltHashStepH(t, t_len, stack);
		beltHashStepG(stack, stack);
		// инициализировать beltWBL ключом theta
		beltWBLStart(stack, stack, 32);
		// k <- H
		memCopy(k, hash, no);
		// k <- beltWBL(k, theta) пока k \notin {1,..., q - 1}
		while (1)
		{
			beltWBLStepE(k, no, stack);
			wwFrom(k, k, no);
			if (!wwIsZero(k, n) && wwCmp(k, ec->order, n) < 0)
				break;
			wwTo(k, no, k);
		}
	}
	// R <- k G
	if (!ecMulA(R, ec->base, ec, k, n, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	qrTo((octet*)R, ecX(R), ec->f, stack);
	// s0 <- belt-hash(oid || R || H) mod 2^l
	beltHashStepH(R, no, hash_state);
	beltHashStepH(hash, no, hash_state);
	beltHashStepG2(sig, no / 2, hash_state);
	wwFrom(s0, sig, no / 2);
	// R <- (s0 + 2^l) d
	zzMul(R, s0, n / 2, d, n, stack);
	R[n + n / 2] = zzAdd(R + n / 2, R + n / 2, d, n);
	// s1 <- R mod q
	zzMod(s1, R, n + n / 2 + 1, ec->order, n, stack);
	// s1 <- (k - s1 - H) mod q
	zzSubMod(s1, k, s1, ec->order, n);
	wwFrom(k, hash, no);
	zzSubMod(s1, s1, k, ec->order, n);
	// выгрузить s1
	wwTo(sig + no / 2, no, s1);
	// все нормально
	blobClose(state);
	return ERR_OK;
}